

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O0

void __thiscall find_ctx::add_result(find_ctx *this,vm_obj_id_t obj,vm_val_t *match_result)

{
  undefined8 *puVar1;
  long lVar2;
  undefined8 *in_RDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  find_entry_page *pg;
  
  if (*(int *)(in_RDI + 2) == 0x20) {
    puVar1 = (undefined8 *)malloc(0x308);
    *puVar1 = 0;
    if (in_RDI[1] == 0) {
      *in_RDI = puVar1;
    }
    else {
      *(undefined8 **)in_RDI[1] = puVar1;
    }
    in_RDI[1] = puVar1;
    *(undefined4 *)(in_RDI + 2) = 0;
  }
  *(undefined4 *)(in_RDI[1] + 8 + (long)*(int *)(in_RDI + 2) * 0x18) = in_ESI;
  lVar2 = in_RDI[1] + 8 + (long)*(int *)(in_RDI + 2) * 0x18;
  *(undefined8 *)(lVar2 + 8) = *in_RDX;
  *(undefined8 *)(lVar2 + 0x10) = in_RDX[1];
  *(int *)(in_RDI + 2) = *(int *)(in_RDI + 2) + 1;
  *(int *)((long)in_RDI + 0x14) = *(int *)((long)in_RDI + 0x14) + 1;
  return;
}

Assistant:

void add_result(vm_obj_id_t obj, const vm_val_t *match_result)
    {
        /* 
         *   if we have no pages, or we're out of room on the current page,
         *   allocate a new page 
         */
        if (result_free == FIND_ENTRIES_PER_PAGE)
        {
            find_entry_page *pg;
            
            /* allocate a new page */
            pg = (find_entry_page *)t3malloc(sizeof(find_entry_page));
            
            /* link it in at the end of the list */
            pg->nxt = 0;
            if (results_tail != 0)
                results_tail->nxt = pg;
            else
                results_head = pg;
            results_tail = pg;

            /* reset the free pointer to the start of the new page */
            result_free = 0;
        }

        /* add this result */
        results_tail->entry[result_free].obj = obj;
        results_tail->entry[result_free].match_result = *match_result;
        ++result_free;
        ++result_cnt;
    }